

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::NewPFor
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  IntegerCODEC *in_RDI;
  Simple16<false> *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffb8;
  IntegerCODEC *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  allocator_type local_17;
  
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00481300;
  Simple16<false>::Simple16(in_stack_ffffffffffffffa0);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c428);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c448);
  __n = in_RDI + 5;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffea;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c465);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,(size_type)__n,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c485);
  __a = &local_17;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c4a2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c4c2);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c4de);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c4fd);
  return;
}

Assistant:

NewPFor()
      : ecoder(), exceptionsPositions(BlockSize), exceptionsValues(BlockSize),
        exceptions(4 * BlockSize + TAIL_MERGIN + 1), tobecoded(BlockSize) {}